

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O0

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector4<LFPConsumer_python_*,_PythonModuleClient_&,_unsigned_long,_boost::python::list_&>_>
::operator()(impl<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector4<LFPConsumer_python_*,_PythonModuleClient_&,_unsigned_long,_boost::python::list_&>_>
             *this,PyObject *args_,PyObject *param_3)

{
  bool bVar1;
  first_reference pfVar2;
  PyObject *result;
  c_t2 c2;
  c_t1 c1;
  c_t0 c0;
  argument_package inner_args;
  PyObject *in_stack_ffffffffffffff48;
  arg_from_python<unsigned_long> *in_stack_ffffffffffffff50;
  undefined1 local_8b [3];
  PyObject *local_88;
  undefined1 local_68 [8];
  undefined4 local_60;
  arg_rvalue_from_python<unsigned_long> local_58;
  arg_lvalue_from_python_base local_30;
  _object *local_28 [2];
  _object *local_18 [2];
  PyObject *local_8;
  
  get<0>(local_28);
  arg_from_python<PythonModuleClient_&>::arg_from_python
            ((arg_from_python<PythonModuleClient_&> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  bVar1 = converter::arg_lvalue_from_python_base::convertible(&local_30);
  if (bVar1) {
    get<1>(local_28);
    arg_from_python<unsigned_long>::arg_from_python
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    bVar1 = converter::arg_rvalue_from_python<unsigned_long>::convertible(&local_58);
    if (bVar1) {
      get<2>(local_28);
      arg_from_python<boost::python::list_&>::arg_from_python
                ((arg_from_python<boost::python::list_&> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
      bVar1 = converter::object_manager_ref_arg_from_python<boost::python::list_&>::convertible
                        ((object_manager_ref_arg_from_python<boost::python::list_&> *)0x3fe412);
      if (bVar1) {
        compressed_pair<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
        ::second((compressed_pair<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                  *)0x3fe475);
        bVar1 = default_call_policies::precall<_object*>(local_28);
        if (bVar1) {
          create_result_converter<_object*,boost::python::to_python_indirect<LFPConsumer_python*,boost::python::detail::make_owning_holder>>
                    (local_18,(to_python_indirect<LFPConsumer_python_*,_boost::python::detail::make_owning_holder>
                               *)0x0);
          pfVar2 = compressed_pair<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                   ::first((compressed_pair<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                            *)0x3fe4c1);
          local_88 = invoke<boost::python::to_python_indirect<LFPConsumer_python*,boost::python::detail::make_owning_holder>,LFPConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::arg_from_python<PythonModuleClient&>,boost::python::arg_from_python<unsigned_long>,boost::python::arg_from_python<boost::python::list&>>
                               (local_8b,pfVar2,&local_30,&local_58,local_68);
          compressed_pair<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
          ::second((compressed_pair<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                    *)0x3fe504);
          local_8 = default_call_policies::postcall<_object*>(local_28,local_88);
        }
        else {
          local_8 = (PyObject *)0x0;
        }
      }
      else {
        local_8 = (PyObject *)0x0;
      }
      local_60 = 1;
      arg_from_python<boost::python::list_&>::~arg_from_python
                ((arg_from_python<boost::python::list_&> *)0x3fe532);
    }
    else {
      local_8 = (PyObject *)0x0;
      local_60 = 1;
    }
    arg_from_python<unsigned_long>::~arg_from_python((arg_from_python<unsigned_long> *)0x3fe53c);
  }
  else {
    local_8 = (PyObject *)0x0;
  }
  return local_8;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }